

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_archive.cpp
# Opt level: O1

bool __thiscall ON_BinaryArchive::WriteArray(ON_BinaryArchive *this,ON_SimpleArray<ON_Xform> *a)

{
  int iVar1;
  bool bVar2;
  ulong uVar3;
  long lVar4;
  bool bVar5;
  ON__INT32 local_34;
  
  iVar1 = a->m_count;
  bVar2 = WriteInt32(this,1,&local_34);
  if (bVar2 && 0 < (long)iVar1) {
    lVar4 = 0;
    uVar3 = 1;
    do {
      bVar2 = WriteDouble(this,0x10,(double *)((long)a->m_a->m_xform[0] + lVar4));
      if (!bVar2) {
        return bVar2;
      }
      lVar4 = lVar4 + 0x80;
      bVar5 = uVar3 < (ulong)(long)iVar1;
      uVar3 = uVar3 + 1;
    } while (bVar5);
  }
  return bVar2;
}

Assistant:

bool
ON_BinaryArchive::WriteArray( const ON_SimpleArray<ON_Xform>& a )
{
  int count = a.Count();
  if ( count < 0 )
    count = 0;
  bool rc = WriteInt( count );
  if ( rc && count > 0 ) 
  {
    int i;
    for ( i = 0; i < count && rc; i++ )
      rc = WriteXform(a[i]);
  }
  return rc;
}